

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,Int value)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  char buffer [32];
  allocator local_29;
  byte local_28 [29];
  byte local_b [3];
  
  iVar3 = (int)this;
  uVar2 = (ulong)(uint)-iVar3;
  if (0 < iVar3) {
    uVar2 = (ulong)this & 0xffffffff;
  }
  local_b[2] = 0;
  pbVar4 = local_b + 1;
  do {
    pbVar5 = pbVar4;
    uVar1 = (uint)uVar2;
    *pbVar5 = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
    pbVar4 = pbVar5 + -1;
    uVar2 = uVar2 / 10;
  } while (9 < uVar1);
  if (iVar3 < 0) {
    *pbVar4 = 0x2d;
    pbVar5 = pbVar4;
  }
  if (pbVar5 < local_28) {
    __assert_fail("current >= buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_writer.cpp"
                  ,0x49,"std::string Json::valueToString(Int)");
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)pbVar5,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString ( Int value )
{
    char buffer[32];
    char* current = buffer + sizeof (buffer);
    bool isNegative = value < 0;

    if ( isNegative )
        value = -value;

    uintToString ( UInt (value), current );

    if ( isNegative )
        *--current = '-';

    assert ( current >= buffer );
    return current;
}